

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

LINK_ENDPOINT_INSTANCE * find_link_endpoint_by_name(SESSION_INSTANCE *session,char *name)

{
  uint uVar1;
  LINK_ENDPOINT_INSTANCE **ppLVar2;
  int iVar3;
  LINK_ENDPOINT_INSTANCE *pLVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = session->link_endpoint_count;
  uVar7 = (ulong)uVar1;
  if (uVar7 == 0) {
    uVar6 = 0;
  }
  else {
    ppLVar2 = session->link_endpoints;
    uVar5 = 0;
    do {
      iVar3 = strcmp(ppLVar2[uVar5]->name,name);
      uVar6 = uVar5;
      if (iVar3 == 0) break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar7;
    } while (uVar7 != uVar5);
  }
  if ((uint)uVar6 == uVar1) {
    pLVar4 = (LINK_ENDPOINT_INSTANCE *)0x0;
  }
  else {
    pLVar4 = session->link_endpoints[uVar6 & 0xffffffff];
  }
  return pLVar4;
}

Assistant:

static LINK_ENDPOINT_INSTANCE* find_link_endpoint_by_name(SESSION_INSTANCE* session, const char* name)
{
    uint32_t i;
    LINK_ENDPOINT_INSTANCE* result;

    for (i = 0; i < session->link_endpoint_count; i++)
    {
        if (strcmp(session->link_endpoints[i]->name, name) == 0)
        {
            break;
        }
    }

    if (i == session->link_endpoint_count)
    {
        result = NULL;
    }
    else
    {
        result = session->link_endpoints[i];
    }

    return result;
}